

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O1

int arg_strncasecmp(char *s1,char *s2,size_t n)

{
  int iVar1;
  int iVar2;
  int iVar3;
  __int32_t **pp_Var4;
  long lVar5;
  bool bVar6;
  
  if (n != 0) {
    pp_Var4 = __ctype_tolower_loc();
    lVar5 = 0;
    do {
      iVar1 = (*pp_Var4)[(byte)s1[lVar5]];
      iVar2 = (*pp_Var4)[(byte)s2[lVar5]];
      iVar3 = iVar1 - iVar2;
      if ((iVar3 != 0) || (s1[lVar5] == 0)) break;
      bVar6 = n - 1 != lVar5;
      lVar5 = lVar5 + 1;
    } while (bVar6);
    if (iVar1 != iVar2) {
      return iVar3;
    }
  }
  return 0;
}

Assistant:

static int arg_strncasecmp(const char * s1, const char * s2, size_t n) {
	if (n != 0) {
		const unsigned char * us1 = (const unsigned char *)s1;
		const unsigned char * us2 = (const unsigned char *)s2;

		do {
			if (tolower(*us1) != tolower(*us2++)) {
				return tolower(*us1) - tolower(*--us2);
			}

			if (*us1++ == '\0') {
				break;
			}
		} while (--n != 0);
	}

	return 0;
}